

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double chsqnonc_pq2s(pqpair pq,double dof,double nonc)

{
  double local_68;
  double pnonc;
  double bound;
  double df;
  double x;
  double q;
  double p;
  int status;
  int which;
  double nonc_local;
  double dof_local;
  pqpair pq_local;
  
  x = pq.q;
  q = pq.p;
  p._4_4_ = 2;
  if (0.0 < q) {
    if (0.0 < x) {
      df = 0.0;
      local_68 = nonc;
      bound = dof;
      _status = nonc;
      nonc_local = dof;
      dof_local = q;
      pq_local.p = x;
      cdfchn((int *)((long)&p + 4),&q,&x,&df,&bound,&local_68,(int *)&p,&pnonc);
      pq_local.q = df;
    }
    else {
      pq_local.q = 9.99e+37;
    }
  }
  else {
    pq_local.q = 0.0;
  }
  return pq_local.q;
}

Assistant:

static double chsqnonc_pq2s( pqpair pq , double dof , double nonc )
{
   int which , status ;
   double p,q,x,df,bound , pnonc ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return  0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return BIGG ;
   x      = 0.0 ;
   df     = dof ;
   pnonc  = nonc ;

   cdfchn( &which , &p , &q , &x , &df , &pnonc , &status , &bound ) ;
   return x ;
}